

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_die.cc
# Opt level: O1

void __thiscall
pstack::Dwarf::DIE::Attribute::Value::Value
          (Value *this,DWARFReader *r,FormEntry *forment,Unit *unit)

{
  Form FVar1;
  element_type *peVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  Exception *this_00;
  ulong uVar5;
  undefined8 *puVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long extraout_RDX;
  long lVar7;
  long extraout_RDX_00;
  Off OVar8;
  long extraout_RDX_01;
  size_t sVar9;
  undefined1 local_1e8 [8];
  uchar q [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  FVar1 = forment->form;
  switch(FVar1) {
  case DW_FORM_addr:
    sVar9 = (size_t)unit->addrlen;
    goto LAB_001350f5;
  case 2:
  case DW_FORM_indirect:
  case DW_FORM_ref_sup4:
  case DW_FORM_strp_sup:
  case DW_FORM_data16:
  case DW_FORM_ref_sup8:
switchD_00134e6d_caseD_2:
    this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
    memset((Exception *)local_1e8,0,0x1a0);
    Exception::Exception((Exception *)local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)q,"unhandled form ",0xf);
    std::ostream::operator<<((ostream *)q,forment->form);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)q," creating value for DIE",0x17);
    Exception::Exception(this_00,(Exception *)local_1e8);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  case DW_FORM_block2:
    puVar6 = (undefined8 *)operator_new(0x10);
    *puVar6 = 0;
    puVar6[1] = 0;
    *(undefined8 **)this = puVar6;
    Reader::readObj<unsigned_char>
              ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               r->off,local_1e8,2);
    OVar8 = r->off + 2;
    r->off = OVar8;
    uVar5 = (ulong)(ushort)local_1e8._0_2_;
    goto LAB_001350d5;
  case DW_FORM_block4:
    puVar6 = (undefined8 *)operator_new(0x10);
    *puVar6 = 0;
    puVar6[1] = 0;
    *(undefined8 **)this = puVar6;
    uVar4 = DWARFReader::getu32(r);
    *(ulong *)(*(long *)this + 8) = (ulong)uVar4;
    OVar8 = r->off;
    goto LAB_001350dc;
  case DW_FORM_data2:
  case DW_FORM_ref2:
  case DW_FORM_strx2:
  case DW_FORM_addrx2:
    Reader::readObj<unsigned_char>
              ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               r->off,local_1e8,2);
    r->off = r->off + 2;
    uVar5 = (ulong)(ushort)local_1e8._0_2_;
    break;
  case DW_FORM_data4:
  case DW_FORM_ref4:
  case DW_FORM_strx4:
  case DW_FORM_addrx4:
    uVar4 = DWARFReader::getu32(r);
    uVar5 = (ulong)uVar4;
    break;
  case DW_FORM_data8:
  case DW_FORM_ref8:
  case DW_FORM_ref_sig8:
    sVar9 = 8;
    goto LAB_001350f5;
  case DW_FORM_string:
    *(Off *)this = r->off;
    peVar2 = (r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar2->_vptr_Reader[7])(&local_48,peVar2,r->off);
    r->off = local_40 + r->off + 1;
    if (local_48 == local_38) {
      return;
    }
    operator_delete(local_48,local_38[0] + 1);
    return;
  case DW_FORM_block:
  case DW_FORM_exprloc:
    puVar6 = (undefined8 *)operator_new(0x10);
    *puVar6 = 0;
    puVar6[1] = 0;
    *(undefined8 **)this = puVar6;
    peVar2 = (r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*peVar2->_vptr_Reader[3])(peVar2,r->off);
    OVar8 = extraout_RDX_00 + r->off;
    r->off = OVar8;
    *(ulong *)(*(long *)this + 8) = CONCAT44(extraout_var_00,iVar3);
    **(Off **)this = OVar8;
    r->off = OVar8 + *(long *)(*(long *)this + 8);
    return;
  case DW_FORM_block1:
    puVar6 = (undefined8 *)operator_new(0x10);
    *puVar6 = 0;
    puVar6[1] = 0;
    *(undefined8 **)this = puVar6;
    Reader::readObj<unsigned_char>
              ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               r->off,local_1e8,1);
    OVar8 = r->off + 1;
    r->off = OVar8;
    uVar5 = (ulong)(byte)local_1e8[0];
LAB_001350d5:
    *(ulong *)(*(long *)this + 8) = uVar5;
LAB_001350dc:
    **(Off **)this = OVar8;
    r->off = OVar8 + *(long *)(*(long *)this + 8);
    return;
  case DW_FORM_data1:
  case DW_FORM_ref1:
  case DW_FORM_strx1:
  case DW_FORM_addrx1:
    Reader::readObj<unsigned_char>
              ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               r->off,local_1e8,1);
    r->off = r->off + 1;
    uVar5 = (ulong)(byte)local_1e8[0];
    break;
  case DW_FORM_flag:
    Reader::readObj<unsigned_char>
              ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               r->off,local_1e8,1);
    r->off = r->off + 1;
    *this = (Value)(local_1e8[0] != (exception)0x0);
    return;
  case DW_FORM_sdata:
    peVar2 = (r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*peVar2->_vptr_Reader[4])(peVar2,r->off);
    uVar5 = CONCAT44(extraout_var_01,iVar3);
    lVar7 = extraout_RDX_01;
    goto LAB_00134e7c;
  case DW_FORM_strp:
  case DW_FORM_line_strp:
    sVar9 = 4;
    if (2 < unit->version) goto switchD_00134e6d_caseD_17;
    goto LAB_00134fa8;
  case DW_FORM_udata:
  case DW_FORM_ref_udata:
  case DW_FORM_strx:
  case DW_FORM_addrx:
  case DW_FORM_loclistx:
  case DW_FORM_rnglistx:
    peVar2 = (r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*peVar2->_vptr_Reader[3])(peVar2,r->off);
    uVar5 = CONCAT44(extraout_var,iVar3);
    lVar7 = extraout_RDX;
LAB_00134e7c:
    r->off = r->off + lVar7;
    break;
  case DW_FORM_ref_addr:
switchD_00134e6d_caseD_10:
    sVar9 = unit->dwarfLen;
    goto LAB_001350f5;
  case DW_FORM_sec_offset:
    goto switchD_00134e6d_caseD_17;
  case DW_FORM_flag_present:
    *this = (Value)0x1;
    return;
  case DW_FORM_implicit_const:
    uVar5 = forment->value;
    break;
  case DW_FORM_strx3:
  case DW_FORM_addrx3:
    sVar9 = 3;
LAB_001350f5:
    uVar5 = DWARFReader::getuint(r,sVar9);
    break;
  default:
    if (FVar1 == DW_FORM_GNU_ref_alt) goto switchD_00134e6d_caseD_10;
    if (FVar1 != DW_FORM_GNU_strp_alt) goto switchD_00134e6d_caseD_2;
    goto switchD_00134e6d_caseD_17;
  }
LAB_001350fd:
  *(ulong *)this = uVar5;
  return;
switchD_00134e6d_caseD_17:
  sVar9 = unit->dwarfLen;
LAB_00134fa8:
  uVar5 = DWARFReader::getint(r,sVar9);
  goto LAB_001350fd;
}

Assistant:

DIE::Attribute::Value::Value(DWARFReader &r, const FormEntry &forment, Unit *unit)
{
    switch (forment.form) {

    case DW_FORM_GNU_strp_alt: {
        addr = r.getint(unit->dwarfLen);
        break;
    }

    case DW_FORM_strp:
    case DW_FORM_line_strp:
        addr = r.getint(unit->version <= 2 ? 4 : unit->dwarfLen);
        break;

    case DW_FORM_GNU_ref_alt:
        addr = r.getuint(unit->dwarfLen);
        break;

    case DW_FORM_addr:
        addr = r.getuint(unit->addrlen);
        break;

    case DW_FORM_data1:
        udata = r.getu8();
        break;

    case DW_FORM_data2:
        udata = r.getu16();
        break;

    case DW_FORM_data4:
        udata = r.getu32();
        break;

    case DW_FORM_data8:
        udata = r.getuint(8);
        break;

    case DW_FORM_sdata:
        sdata = r.getsleb128();
        break;

    case DW_FORM_udata:
        udata = r.getuleb128();
        break;

    // offsets in various sections...
    case DW_FORM_strx:
    case DW_FORM_loclistx:
    case DW_FORM_rnglistx:
    case DW_FORM_addrx:
    case DW_FORM_ref_udata:
        addr = r.getuleb128();
        break;

    case DW_FORM_strx1:
    case DW_FORM_addrx1:
    case DW_FORM_ref1:
        addr = r.getu8();
        break;

    case DW_FORM_strx2:
    case DW_FORM_addrx2:
    case DW_FORM_ref2:
        addr = r.getu16();
        break;

    case DW_FORM_addrx3:
    case DW_FORM_strx3:
        addr = r.getuint(3);
        break;

    case DW_FORM_strx4:
    case DW_FORM_addrx4:
    case DW_FORM_ref4:
        addr = r.getu32();
        break;

    case DW_FORM_ref_addr:
        addr = r.getuint(unit->dwarfLen);
        break;

    case DW_FORM_ref8:
        addr = r.getuint(8);
        break;

    case DW_FORM_string:
        addr = r.getOffset();
        r.getstring();
        break;

    case DW_FORM_block1:
        block = new Block();
        block->length = r.getu8();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_block2:
        block = new Block();
        block->length = r.getu16();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_block4:
        block = new Block();
        block->length = r.getu32();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_exprloc:
    case DW_FORM_block:
        block = new Block();
        block->length = r.getuleb128();
        block->offset = r.getOffset();
        r.skip(block->length);
        break;

    case DW_FORM_flag:
        flag = r.getu8() != 0;
        break;

    case DW_FORM_flag_present:
        flag = true;
        break;

    case DW_FORM_sec_offset:
        addr = r.getint(unit->dwarfLen);
        break;

    case DW_FORM_ref_sig8:
        signature = r.getuint(8);
        break;

    case DW_FORM_implicit_const:
        sdata = forment.value;
        break;

    default:
        throw (Exception() << "unhandled form " << forment.form  << " creating value for DIE");
    }
}